

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pal_sorting.cpp
# Opt level: O0

void sorting::indexed(vector<Palette,_std::allocator<Palette>_> *palettes,int palSize,
                     png_color *palRGB,png_byte *palAlpha)

{
  anon_class_16_2_8efa2b64 __comp;
  vector<Palette,_std::allocator<Palette>_> *this;
  bool bVar1;
  reference this_00;
  iterator __first;
  iterator __last;
  Palette *pal;
  iterator __end1;
  iterator __begin1;
  vector<Palette,_std::allocator<Palette>_> *__range1;
  anon_class_16_2_17bc626a pngToRgb;
  png_byte *palAlpha_local;
  png_color *palRGB_local;
  vector<Palette,_std::allocator<Palette>_> *pvStack_10;
  int palSize_local;
  vector<Palette,_std::allocator<Palette>_> *palettes_local;
  
  pngToRgb.palAlpha = (png_byte **)palAlpha;
  palAlpha_local = &palRGB->red;
  palRGB_local._4_4_ = palSize;
  pvStack_10 = palettes;
  Options::verbosePrint(&options,'\x02',"Sorting palettes using embedded palette...\n");
  this = pvStack_10;
  __range1 = (vector<Palette,_std::allocator<Palette>_> *)&palAlpha_local;
  pngToRgb.palRGB = (png_color **)&pngToRgb.palAlpha;
  __end1 = std::vector<Palette,_std::allocator<Palette>_>::begin(pvStack_10);
  pal = (Palette *)std::vector<Palette,_std::allocator<Palette>_>::end(this);
  while( true ) {
    bVar1 = __gnu_cxx::operator==<Palette_*,_std::vector<Palette,_std::allocator<Palette>_>_>
                      (&__end1,(__normal_iterator<Palette_*,_std::vector<Palette,_std::allocator<Palette>_>_>
                                *)&pal);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    this_00 = __gnu_cxx::
              __normal_iterator<Palette_*,_std::vector<Palette,_std::allocator<Palette>_>_>::
              operator*(&__end1);
    __first = Palette::begin(this_00);
    __last = Palette::end(this_00);
    __comp.pngToRgb = (anon_class_16_2_17bc626a *)&__range1;
    __comp.palSize = (int *)((long)&palRGB_local + 4);
    std::
    sort<unsigned_short*,sorting::indexed(std::vector<Palette,std::allocator<Palette>>&,int,png_color_struct_const*,unsigned_char*)::__0>
              (__first,__last,__comp);
    __gnu_cxx::__normal_iterator<Palette_*,_std::vector<Palette,_std::allocator<Palette>_>_>::
    operator++(&__end1);
  }
  return;
}

Assistant:

void indexed(std::vector<Palette> &palettes, int palSize, png_color const *palRGB,
             png_byte *palAlpha) {
	options.verbosePrint(Options::VERB_LOG_ACT, "Sorting palettes using embedded palette...\n");

	auto pngToRgb = [&palRGB, &palAlpha](int index) {
		auto const &c = palRGB[index];
		return Rgba(c.red, c.green, c.blue, palAlpha ? palAlpha[index] : 0xFF);
	};

	for (Palette &pal : palettes) {
		std::sort(pal.begin(), pal.end(), [&](uint16_t lhs, uint16_t rhs) {
			// Iterate through the PNG's palette, looking for either of the two
			for (int i = 0; i < palSize; ++i) {
				uint16_t color = pngToRgb(i).cgbColor();
				if (color == Rgba::transparent) {
					continue;
				}
				// Return whether lhs < rhs
				if (color == rhs) {
					return false;
				}
				if (color == lhs) {
					return true;
				}
			}
			unreachable_(); // This should not be possible
		});
	}
}